

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O3

int nghttp2_stream_dep_insert_subtree(nghttp2_stream *dep_stream,nghttp2_stream *stream)

{
  nghttp2_stream *pnVar1;
  int iVar2;
  nghttp2_stream *pnVar3;
  nghttp2_stream **ppnVar4;
  long lVar5;
  nghttp2_stream *stream_00;
  
  stream->sum_dep_weight = stream->sum_dep_weight + dep_stream->sum_dep_weight;
  dep_stream->sum_dep_weight = stream->weight;
  stream_00 = dep_stream->dep_next;
  dep_stream->dep_next = stream;
  stream->dep_prev = dep_stream;
  if (stream_00 != (nghttp2_stream *)0x0) {
    pnVar1 = stream->dep_next;
    if (stream->dep_next == (nghttp2_stream *)0x0) {
      ppnVar4 = &stream->dep_next;
      lVar5 = 0x60;
      pnVar3 = stream;
    }
    else {
      do {
        pnVar3 = pnVar1;
        pnVar1 = pnVar3->sib_next;
      } while (pnVar3->sib_next != (nghttp2_stream *)0x0);
      ppnVar4 = &pnVar3->sib_next;
      lVar5 = 0x70;
    }
    *ppnVar4 = stream_00;
    *(nghttp2_stream **)((long)&(stream_00->pq_entry).index + lVar5) = pnVar3;
    do {
      stream_00->dep_prev = stream;
      if ((stream_00->queued != '\0') &&
         (iVar2 = stream_obq_move(stream,dep_stream,stream_00), iVar2 != 0)) {
        return iVar2;
      }
      stream_00 = stream_00->sib_next;
    } while (stream_00 != (nghttp2_stream *)0x0);
  }
  if ((((stream->item != (nghttp2_outbound_item *)0x0) && ((stream->flags & 0xc) == 0)) ||
      (iVar2 = nghttp2_pq_empty(&stream->obq), iVar2 == 0)) &&
     (iVar2 = stream_obq_push(dep_stream,stream), iVar2 != 0)) {
    return iVar2;
  }
  return 0;
}

Assistant:

int nghttp2_stream_dep_insert_subtree(nghttp2_stream *dep_stream,
                                      nghttp2_stream *stream) {
  nghttp2_stream *last_sib;
  nghttp2_stream *dep_next;
  nghttp2_stream *si;
  int rv;

  DEBUGF("stream: dep_insert_subtree dep_stream(%p)=%d stream(%p)=%d\n",
         dep_stream, dep_stream->stream_id, stream, stream->stream_id);

  stream->sum_dep_weight += dep_stream->sum_dep_weight;
  dep_stream->sum_dep_weight = stream->weight;

  if (dep_stream->dep_next) {
    dep_next = dep_stream->dep_next;

    link_dep(dep_stream, stream);

    if (stream->dep_next) {
      last_sib = stream_last_sib(stream->dep_next);

      link_sib(last_sib, dep_next);
    } else {
      link_dep(stream, dep_next);
    }

    for (si = dep_next; si; si = si->sib_next) {
      si->dep_prev = stream;
      if (si->queued) {
        rv = stream_obq_move(stream, dep_stream, si);
        if (rv != 0) {
          return rv;
        }
      }
    }
  } else {
    link_dep(dep_stream, stream);
  }

  if (stream_subtree_active(stream)) {
    rv = stream_obq_push(dep_stream, stream);
    if (rv != 0) {
      return rv;
    }
  }

  validate_tree(dep_stream);

  return 0;
}